

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O1

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)4>::
dispatch<true,TI::TMS::SMSSequencer<(TI::TMS::Personality)4>>
          (Base<(TI::TMS::Personality)4> *this,SMSSequencer<(TI::TMS::Personality)4> *fetcher,
          int start,int end)

{
  switch(start) {
  case 0:
    do_external_slot((fetcher->fetcher).base,0);
    if (end == 1) {
      return;
    }
  case 1:
    do_external_slot((fetcher->fetcher).base,2);
    if (end == 2) {
      return;
    }
switchD_001ab0f6_caseD_2:
    do_external_slot((fetcher->fetcher).base,4);
    if (end == 3) {
      return;
    }
switchD_001ab0f6_caseD_3:
    SMSSequencer<(TI::TMS::Personality)4>::fetch<3>(fetcher);
    if (end - 4U < 0xc) {
      return;
    }
    break;
  case 2:
    goto switchD_001ab0f6_caseD_2;
  case 3:
    goto switchD_001ab0f6_caseD_3;
  case 4:
    if (end - 5U < 0xb) {
      return;
    }
    break;
  case 5:
    if (end - 6U < 10) {
      return;
    }
    break;
  case 6:
    if (end - 7U < 9) {
      return;
    }
    break;
  case 7:
    if ((end & 0xfffffff8U) == 8) {
      return;
    }
    break;
  case 8:
    if (end - 9U < 7) {
      return;
    }
    break;
  case 9:
    if (end - 10U < 6) {
      return;
    }
    break;
  case 10:
    if (end - 0xbU < 5) {
      return;
    }
    break;
  case 0xb:
    if ((end & 0xfffffffcU) == 0xc) {
      return;
    }
    break;
  case 0xc:
    if (end - 0xdU < 3) {
      return;
    }
    break;
  case 0xd:
    if ((end & 0xfffffffeU) == 0xe) {
      return;
    }
    break;
  case 0xe:
    if (end == 0xf) {
      return;
    }
    break;
  case 0xf:
    break;
  case 0x10:
    goto switchD_001ab0f6_caseD_10;
  case 0x11:
    goto switchD_001ab0f6_caseD_11;
  case 0x12:
    if (end - 0x13U < 7) {
      return;
    }
    goto switchD_001ab0f6_caseD_19;
  case 0x13:
    if (end - 0x14U < 6) {
      return;
    }
    goto switchD_001ab0f6_caseD_19;
  case 0x14:
    if (end - 0x15U < 5) {
      return;
    }
    goto switchD_001ab0f6_caseD_19;
  case 0x15:
    if (end - 0x16U < 4) {
      return;
    }
    goto switchD_001ab0f6_caseD_19;
  case 0x16:
    if (end - 0x17U < 3) {
      return;
    }
    goto switchD_001ab0f6_caseD_19;
  case 0x17:
    if ((end & 0xfffffffeU) == 0x18) {
      return;
    }
    goto switchD_001ab0f6_caseD_19;
  case 0x18:
    if (end == 0x19) {
      return;
    }
  case 0x19:
    goto switchD_001ab0f6_caseD_19;
  case 0x1a:
    goto switchD_001ab0f6_caseD_1a;
  case 0x1b:
    goto switchD_001ab0f6_caseD_1b;
  case 0x1c:
    if (end == 0x1d) {
      return;
    }
  case 0x1d:
    goto switchD_001ab0f6_caseD_1d;
  case 0x1e:
    goto switchD_001ab0f6_caseD_1e;
  case 0x1f:
    goto switchD_001ab0f6_caseD_1f;
  case 0x20:
    if (end == 0x21) {
      return;
    }
  case 0x21:
    goto switchD_001ab0f6_caseD_21;
  case 0x22:
    goto switchD_001ab0f6_caseD_22;
  case 0x23:
    goto switchD_001ab0f6_caseD_23;
  case 0x24:
    if (end == 0x25) {
      return;
    }
  case 0x25:
    goto switchD_001ab0f6_caseD_25;
  case 0x26:
    goto switchD_001ab0f6_caseD_26;
  case 0x27:
    goto switchD_001ab0f6_caseD_27;
  case 0x28:
    if (end == 0x29) {
      return;
    }
  case 0x29:
    goto switchD_001ab0f6_caseD_29;
  case 0x2a:
    goto switchD_001ab0f6_caseD_2a;
  case 0x2b:
    goto switchD_001ab0f6_caseD_2b;
  case 0x2c:
    if (end == 0x2d) {
      return;
    }
  case 0x2d:
    goto switchD_001ab0f6_caseD_2d;
  case 0x2e:
    goto switchD_001ab0f6_caseD_2e;
  case 0x2f:
    goto switchD_001ab0f6_caseD_2f;
  case 0x30:
    if (end == 0x31) {
      return;
    }
  case 0x31:
    goto switchD_001ab0f6_caseD_31;
  case 0x32:
    goto switchD_001ab0f6_caseD_32;
  case 0x33:
    goto switchD_001ab0f6_caseD_33;
  case 0x34:
    if (end == 0x35) {
      return;
    }
  case 0x35:
    goto switchD_001ab0f6_caseD_35;
  case 0x36:
    goto switchD_001ab0f6_caseD_36;
  case 0x37:
    goto switchD_001ab0f6_caseD_37;
  case 0x38:
    if (end == 0x39) {
      return;
    }
  case 0x39:
    goto switchD_001ab0f6_caseD_39;
  case 0x3a:
    goto switchD_001ab0f6_caseD_3a;
  case 0x3b:
    goto switchD_001ab0f6_caseD_3b;
  case 0x3c:
    if (end == 0x3d) {
      return;
    }
  case 0x3d:
    goto switchD_001ab0f6_caseD_3d;
  case 0x3e:
    goto switchD_001ab0f6_caseD_3e;
  case 0x3f:
    goto switchD_001ab0f6_caseD_3f;
  case 0x40:
    if (end == 0x41) {
      return;
    }
  case 0x41:
    goto switchD_001ab0f6_caseD_41;
  case 0x42:
    goto switchD_001ab0f6_caseD_42;
  case 0x43:
    goto switchD_001ab0f6_caseD_43;
  case 0x44:
    if (end == 0x45) {
      return;
    }
  case 0x45:
    goto switchD_001ab0f6_caseD_45;
  case 0x46:
    goto switchD_001ab0f6_caseD_46;
  case 0x47:
    goto switchD_001ab0f6_caseD_47;
  case 0x48:
    if (end == 0x49) {
      return;
    }
  case 0x49:
    goto switchD_001ab0f6_caseD_49;
  case 0x4a:
    goto switchD_001ab0f6_caseD_4a;
  case 0x4b:
    goto switchD_001ab0f6_caseD_4b;
  case 0x4c:
    if (end == 0x4d) {
      return;
    }
  case 0x4d:
    goto switchD_001ab0f6_caseD_4d;
  case 0x4e:
    goto switchD_001ab0f6_caseD_4e;
  case 0x4f:
    goto switchD_001ab0f6_caseD_4f;
  case 0x50:
    if (end == 0x51) {
      return;
    }
  case 0x51:
    goto switchD_001ab0f6_caseD_51;
  case 0x52:
    goto switchD_001ab0f6_caseD_52;
  case 0x53:
    goto switchD_001ab0f6_caseD_53;
  case 0x54:
    if (end == 0x55) {
      return;
    }
  case 0x55:
    goto switchD_001ab0f6_caseD_55;
  case 0x56:
    goto switchD_001ab0f6_caseD_56;
  case 0x57:
    goto switchD_001ab0f6_caseD_57;
  case 0x58:
    if (end == 0x59) {
      return;
    }
  case 0x59:
    goto switchD_001ab0f6_caseD_59;
  case 0x5a:
    goto switchD_001ab0f6_caseD_5a;
  case 0x5b:
    goto switchD_001ab0f6_caseD_5b;
  case 0x5c:
    if (end == 0x5d) {
      return;
    }
  case 0x5d:
    goto switchD_001ab0f6_caseD_5d;
  case 0x5e:
    goto switchD_001ab0f6_caseD_5e;
  case 0x5f:
    goto switchD_001ab0f6_caseD_5f;
  case 0x60:
    if (end == 0x61) {
      return;
    }
  case 0x61:
    goto switchD_001ab0f6_caseD_61;
  case 0x62:
    goto switchD_001ab0f6_caseD_62;
  case 99:
    goto switchD_001ab0f6_caseD_63;
  case 100:
    if (end == 0x65) {
      return;
    }
  case 0x65:
    goto switchD_001ab0f6_caseD_65;
  case 0x66:
    goto switchD_001ab0f6_caseD_66;
  case 0x67:
    goto switchD_001ab0f6_caseD_67;
  case 0x68:
    if (end == 0x69) {
      return;
    }
  case 0x69:
    goto switchD_001ab0f6_caseD_69;
  case 0x6a:
    goto switchD_001ab0f6_caseD_6a;
  case 0x6b:
    goto switchD_001ab0f6_caseD_6b;
  case 0x6c:
    if (end == 0x6d) {
      return;
    }
  case 0x6d:
    goto switchD_001ab0f6_caseD_6d;
  case 0x6e:
    goto switchD_001ab0f6_caseD_6e;
  case 0x6f:
    goto switchD_001ab0f6_caseD_6f;
  case 0x70:
    if (end == 0x71) {
      return;
    }
  case 0x71:
    goto switchD_001ab0f6_caseD_71;
  case 0x72:
    goto switchD_001ab0f6_caseD_72;
  case 0x73:
    goto switchD_001ab0f6_caseD_73;
  case 0x74:
    if (end == 0x75) {
      return;
    }
  case 0x75:
    goto switchD_001ab0f6_caseD_75;
  case 0x76:
    goto switchD_001ab0f6_caseD_76;
  case 0x77:
    goto switchD_001ab0f6_caseD_77;
  case 0x78:
    if (end == 0x79) {
      return;
    }
  case 0x79:
    goto switchD_001ab0f6_caseD_79;
  case 0x7a:
    goto switchD_001ab0f6_caseD_7a;
  case 0x7b:
    goto switchD_001ab0f6_caseD_7b;
  case 0x7c:
    if (end == 0x7d) {
      return;
    }
  case 0x7d:
    goto switchD_001ab0f6_caseD_7d;
  case 0x7e:
    goto switchD_001ab0f6_caseD_7e;
  case 0x7f:
    goto switchD_001ab0f6_caseD_7f;
  case 0x80:
    if (end == 0x81) {
      return;
    }
  case 0x81:
    goto switchD_001ab0f6_caseD_81;
  case 0x82:
    goto switchD_001ab0f6_caseD_82;
  case 0x83:
    goto switchD_001ab0f6_caseD_83;
  case 0x84:
    if (end == 0x85) {
      return;
    }
  case 0x85:
    goto switchD_001ab0f6_caseD_85;
  case 0x86:
    goto switchD_001ab0f6_caseD_86;
  case 0x87:
    goto switchD_001ab0f6_caseD_87;
  case 0x88:
    if (end == 0x89) {
      return;
    }
  case 0x89:
    goto switchD_001ab0f6_caseD_89;
  case 0x8a:
    goto switchD_001ab0f6_caseD_8a;
  case 0x8b:
    goto switchD_001ab0f6_caseD_8b;
  case 0x8c:
    if (end == 0x8d) {
      return;
    }
  case 0x8d:
    goto switchD_001ab0f6_caseD_8d;
  case 0x8e:
    goto switchD_001ab0f6_caseD_8e;
  case 0x8f:
    goto switchD_001ab0f6_caseD_8f;
  case 0x90:
    if (end == 0x91) {
      return;
    }
  case 0x91:
    goto switchD_001ab0f6_caseD_91;
  case 0x92:
    goto switchD_001ab0f6_caseD_92;
  case 0x93:
    goto switchD_001ab0f6_caseD_93;
  case 0x94:
    if (end == 0x95) {
      return;
    }
  case 0x95:
    goto switchD_001ab0f6_caseD_95;
  case 0x96:
    goto switchD_001ab0f6_caseD_96;
  case 0x97:
    goto switchD_001ab0f6_caseD_97;
  case 0x98:
    if (end == 0x99) {
      return;
    }
  case 0x99:
    goto switchD_001ab0f6_caseD_99;
  case 0x9a:
    goto switchD_001ab0f6_caseD_9a;
  case 0x9b:
    goto switchD_001ab0f6_caseD_9b;
  case 0x9c:
    goto switchD_001ab0f6_caseD_9c;
  case 0x9d:
    goto switchD_001ab0f6_caseD_9d;
  case 0x9e:
    if (end - 0x9fU < 0xb) {
      return;
    }
    goto switchD_001ab0f6_caseD_a9;
  case 0x9f:
    if (end - 0xa0U < 10) {
      return;
    }
    goto switchD_001ab0f6_caseD_a9;
  case 0xa0:
    if (end - 0xa1U < 9) {
      return;
    }
    goto switchD_001ab0f6_caseD_a9;
  case 0xa1:
    if (end - 0xa2U < 8) {
      return;
    }
    goto switchD_001ab0f6_caseD_a9;
  case 0xa2:
    if (end - 0xa3U < 7) {
      return;
    }
    goto switchD_001ab0f6_caseD_a9;
  case 0xa3:
    if (end - 0xa4U < 6) {
      return;
    }
    goto switchD_001ab0f6_caseD_a9;
  case 0xa4:
    if (end - 0xa5U < 5) {
      return;
    }
    goto switchD_001ab0f6_caseD_a9;
  case 0xa5:
    if (end - 0xa6U < 4) {
      return;
    }
    goto switchD_001ab0f6_caseD_a9;
  case 0xa6:
    if (end - 0xa7U < 3) {
      return;
    }
    goto switchD_001ab0f6_caseD_a9;
  case 0xa7:
    if ((end & 0xfffffffeU) == 0xa8) {
      return;
    }
    goto switchD_001ab0f6_caseD_a9;
  case 0xa8:
    if (end == 0xa9) {
      return;
    }
  case 0xa9:
    goto switchD_001ab0f6_caseD_a9;
  case 0xaa:
    goto switchD_001ab0f6_caseD_aa;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Components/9918/Implementation/../Implementation/Fetch.hpp"
                  ,0x3b,
                  "void TI::TMS::Base<TI::TMS::SMS2VDP>::dispatch(SequencerT &, int, int) [personality = TI::TMS::SMS2VDP, use_end = true, Fetcher = TI::TMS::SMSSequencer<TI::TMS::SMS2VDP>]"
                 );
  }
  do_external_slot((fetcher->fetcher).base,0x1e);
  if (end != 0x10) {
switchD_001ab0f6_caseD_10:
    do_external_slot((fetcher->fetcher).base,0x20);
    if (end != 0x11) {
switchD_001ab0f6_caseD_11:
      SMSSequencer<(TI::TMS::Personality)4>::fetch<17>(fetcher);
      if (7 < end - 0x12U) {
switchD_001ab0f6_caseD_19:
        SMSFetcher<(TI::TMS::Personality)4>::fetch_tile_name(&fetcher->fetcher,0);
        if (end != 0x1a) {
switchD_001ab0f6_caseD_1a:
          do_external_slot((fetcher->fetcher).base,0x34);
          if (end != 0x1b) {
switchD_001ab0f6_caseD_1b:
            SMSSequencer<(TI::TMS::Personality)4>::fetch<27>(fetcher);
            if ((end & 0xfffffffeU) != 0x1c) {
switchD_001ab0f6_caseD_1d:
              SMSFetcher<(TI::TMS::Personality)4>::fetch_tile_name(&fetcher->fetcher,1);
              if (end != 0x1e) {
switchD_001ab0f6_caseD_1e:
                SMSSequencer<(TI::TMS::Personality)4>::fetch<30>(fetcher);
                if (end != 0x1f) {
switchD_001ab0f6_caseD_1f:
                  SMSSequencer<(TI::TMS::Personality)4>::fetch<31>(fetcher);
                  if ((end & 0xfffffffeU) != 0x20) {
switchD_001ab0f6_caseD_21:
                    SMSFetcher<(TI::TMS::Personality)4>::fetch_tile_name(&fetcher->fetcher,2);
                    if (end != 0x22) {
switchD_001ab0f6_caseD_22:
                      SMSSequencer<(TI::TMS::Personality)4>::fetch<34>(fetcher);
                      if (end != 0x23) {
switchD_001ab0f6_caseD_23:
                        SMSSequencer<(TI::TMS::Personality)4>::fetch<35>(fetcher);
                        if ((end & 0xfffffffeU) != 0x24) {
switchD_001ab0f6_caseD_25:
                          SMSFetcher<(TI::TMS::Personality)4>::fetch_tile_name(&fetcher->fetcher,3);
                          if (end != 0x26) {
switchD_001ab0f6_caseD_26:
                            SMSSequencer<(TI::TMS::Personality)4>::fetch<38>(fetcher);
                            if (end != 0x27) {
switchD_001ab0f6_caseD_27:
                              SMSSequencer<(TI::TMS::Personality)4>::fetch<39>(fetcher);
                              if ((end & 0xfffffffeU) != 0x28) {
switchD_001ab0f6_caseD_29:
                                SMSFetcher<(TI::TMS::Personality)4>::fetch_tile_name
                                          (&fetcher->fetcher,4);
                                if (end != 0x2a) {
switchD_001ab0f6_caseD_2a:
                                  do_external_slot((fetcher->fetcher).base,0x54);
                                  if (end != 0x2b) {
switchD_001ab0f6_caseD_2b:
                                    SMSSequencer<(TI::TMS::Personality)4>::fetch<43>(fetcher);
                                    if ((end & 0xfffffffeU) != 0x2c) {
switchD_001ab0f6_caseD_2d:
                                      SMSFetcher<(TI::TMS::Personality)4>::fetch_tile_name
                                                (&fetcher->fetcher,5);
                                      if (end != 0x2e) {
switchD_001ab0f6_caseD_2e:
                                        SMSSequencer<(TI::TMS::Personality)4>::fetch<46>(fetcher);
                                        if (end != 0x2f) {
switchD_001ab0f6_caseD_2f:
                                          SMSSequencer<(TI::TMS::Personality)4>::fetch<47>(fetcher);
                                          if ((end & 0xfffffffeU) != 0x30) {
switchD_001ab0f6_caseD_31:
                                            SMSFetcher<(TI::TMS::Personality)4>::fetch_tile_name
                                                      (&fetcher->fetcher,6);
                                            if (end != 0x32) {
switchD_001ab0f6_caseD_32:
                                              SMSSequencer<(TI::TMS::Personality)4>::fetch<50>
                                                        (fetcher);
                                              if (end != 0x33) {
switchD_001ab0f6_caseD_33:
                                                SMSSequencer<(TI::TMS::Personality)4>::fetch<51>
                                                          (fetcher);
                                                if ((end & 0xfffffffeU) != 0x34) {
switchD_001ab0f6_caseD_35:
                                                  SMSFetcher<(TI::TMS::Personality)4>::
                                                  fetch_tile_name(&fetcher->fetcher,7);
                                                  if (end != 0x36) {
switchD_001ab0f6_caseD_36:
                                                    SMSSequencer<(TI::TMS::Personality)4>::fetch<54>
                                                              (fetcher);
                                                    if (end != 0x37) {
switchD_001ab0f6_caseD_37:
                                                      SMSSequencer<(TI::TMS::Personality)4>::
                                                      fetch<55>(fetcher);
                                                      if ((end & 0xfffffffeU) != 0x38) {
switchD_001ab0f6_caseD_39:
                                                        SMSFetcher<(TI::TMS::Personality)4>::
                                                        fetch_tile_name(&fetcher->fetcher,8);
                                                        if (end != 0x3a) {
switchD_001ab0f6_caseD_3a:
                                                          do_external_slot((fetcher->fetcher).base,
                                                                           0x74);
                                                          if (end != 0x3b) {
switchD_001ab0f6_caseD_3b:
                                                            SMSSequencer<(TI::TMS::Personality)4>::
                                                            fetch<59>(fetcher);
                                                            if ((end & 0xfffffffeU) != 0x3c) {
switchD_001ab0f6_caseD_3d:
                                                              SMSFetcher<(TI::TMS::Personality)4>::
                                                              fetch_tile_name(&fetcher->fetcher,9);
                                                              if (end != 0x3e) {
switchD_001ab0f6_caseD_3e:
                                                                                                                                
                                                  SMSSequencer<(TI::TMS::Personality)4>::fetch<62>
                                                            (fetcher);
                                                  if (end != 0x3f) {
switchD_001ab0f6_caseD_3f:
                                                    SMSSequencer<(TI::TMS::Personality)4>::fetch<63>
                                                              (fetcher);
                                                    if ((end & 0xfffffffeU) != 0x40) {
switchD_001ab0f6_caseD_41:
                                                      SMSFetcher<(TI::TMS::Personality)4>::
                                                      fetch_tile_name(&fetcher->fetcher,10);
                                                      if (end != 0x42) {
switchD_001ab0f6_caseD_42:
                                                        SMSSequencer<(TI::TMS::Personality)4>::
                                                        fetch<66>(fetcher);
                                                        if (end != 0x43) {
switchD_001ab0f6_caseD_43:
                                                          SMSSequencer<(TI::TMS::Personality)4>::
                                                          fetch<67>(fetcher);
                                                          if ((end & 0xfffffffeU) != 0x44) {
switchD_001ab0f6_caseD_45:
                                                            SMSFetcher<(TI::TMS::Personality)4>::
                                                            fetch_tile_name(&fetcher->fetcher,0xb);
                                                            if (end != 0x46) {
switchD_001ab0f6_caseD_46:
                                                              SMSSequencer<(TI::TMS::Personality)4>
                                                              ::fetch<70>(fetcher);
                                                              if (end != 0x47) {
switchD_001ab0f6_caseD_47:
                                                                                                                                
                                                  SMSSequencer<(TI::TMS::Personality)4>::fetch<71>
                                                            (fetcher);
                                                  if ((end & 0xfffffffeU) != 0x48) {
switchD_001ab0f6_caseD_49:
                                                    SMSFetcher<(TI::TMS::Personality)4>::
                                                    fetch_tile_name(&fetcher->fetcher,0xc);
                                                    if (end != 0x4a) {
switchD_001ab0f6_caseD_4a:
                                                      do_external_slot((fetcher->fetcher).base,0x94)
                                                      ;
                                                      if (end != 0x4b) {
switchD_001ab0f6_caseD_4b:
                                                        SMSSequencer<(TI::TMS::Personality)4>::
                                                        fetch<75>(fetcher);
                                                        if ((end & 0xfffffffeU) != 0x4c) {
switchD_001ab0f6_caseD_4d:
                                                          SMSFetcher<(TI::TMS::Personality)4>::
                                                          fetch_tile_name(&fetcher->fetcher,0xd);
                                                          if (end != 0x4e) {
switchD_001ab0f6_caseD_4e:
                                                            SMSSequencer<(TI::TMS::Personality)4>::
                                                            fetch<78>(fetcher);
                                                            if (end != 0x4f) {
switchD_001ab0f6_caseD_4f:
                                                              SMSSequencer<(TI::TMS::Personality)4>
                                                              ::fetch<79>(fetcher);
                                                              if ((end & 0xfffffffeU) != 0x50) {
switchD_001ab0f6_caseD_51:
                                                                SMSFetcher<(TI::TMS::Personality)4>
                                                                ::fetch_tile_name(&fetcher->fetcher,
                                                                                  0xe);
                                                                if (end != 0x52) {
switchD_001ab0f6_caseD_52:
                                                                                                                                    
                                                  SMSSequencer<(TI::TMS::Personality)4>::fetch<82>
                                                            (fetcher);
                                                  if (end != 0x53) {
switchD_001ab0f6_caseD_53:
                                                    SMSSequencer<(TI::TMS::Personality)4>::fetch<83>
                                                              (fetcher);
                                                    if ((end & 0xfffffffeU) != 0x54) {
switchD_001ab0f6_caseD_55:
                                                      SMSFetcher<(TI::TMS::Personality)4>::
                                                      fetch_tile_name(&fetcher->fetcher,0xf);
                                                      if (end != 0x56) {
switchD_001ab0f6_caseD_56:
                                                        SMSSequencer<(TI::TMS::Personality)4>::
                                                        fetch<86>(fetcher);
                                                        if (end != 0x57) {
switchD_001ab0f6_caseD_57:
                                                          SMSSequencer<(TI::TMS::Personality)4>::
                                                          fetch<87>(fetcher);
                                                          if ((end & 0xfffffffeU) != 0x58) {
switchD_001ab0f6_caseD_59:
                                                            SMSFetcher<(TI::TMS::Personality)4>::
                                                            fetch_tile_name(&fetcher->fetcher,0x10);
                                                            if (end != 0x5a) {
switchD_001ab0f6_caseD_5a:
                                                              do_external_slot((fetcher->fetcher).
                                                                               base,0xb4);
                                                              if (end != 0x5b) {
switchD_001ab0f6_caseD_5b:
                                                                                                                                
                                                  SMSSequencer<(TI::TMS::Personality)4>::fetch<91>
                                                            (fetcher);
                                                  if ((end & 0xfffffffeU) != 0x5c) {
switchD_001ab0f6_caseD_5d:
                                                    SMSFetcher<(TI::TMS::Personality)4>::
                                                    fetch_tile_name(&fetcher->fetcher,0x11);
                                                    if (end != 0x5e) {
switchD_001ab0f6_caseD_5e:
                                                      SMSSequencer<(TI::TMS::Personality)4>::
                                                      fetch<94>(fetcher);
                                                      if (end != 0x5f) {
switchD_001ab0f6_caseD_5f:
                                                        SMSSequencer<(TI::TMS::Personality)4>::
                                                        fetch<95>(fetcher);
                                                        if ((end & 0xfffffffeU) != 0x60) {
switchD_001ab0f6_caseD_61:
                                                          SMSFetcher<(TI::TMS::Personality)4>::
                                                          fetch_tile_name(&fetcher->fetcher,0x12);
                                                          if (end != 0x62) {
switchD_001ab0f6_caseD_62:
                                                            SMSSequencer<(TI::TMS::Personality)4>::
                                                            fetch<98>(fetcher);
                                                            if (end != 99) {
switchD_001ab0f6_caseD_63:
                                                              SMSSequencer<(TI::TMS::Personality)4>
                                                              ::fetch<99>(fetcher);
                                                              if ((end & 0xfffffffeU) != 100) {
switchD_001ab0f6_caseD_65:
                                                                SMSFetcher<(TI::TMS::Personality)4>
                                                                ::fetch_tile_name(&fetcher->fetcher,
                                                                                  0x13);
                                                                if (end != 0x66) {
switchD_001ab0f6_caseD_66:
                                                                                                                                    
                                                  SMSSequencer<(TI::TMS::Personality)4>::fetch<102>
                                                            (fetcher);
                                                  if (end != 0x67) {
switchD_001ab0f6_caseD_67:
                                                    SMSSequencer<(TI::TMS::Personality)4>::
                                                    fetch<103>(fetcher);
                                                    if ((end & 0xfffffffeU) != 0x68) {
switchD_001ab0f6_caseD_69:
                                                      SMSFetcher<(TI::TMS::Personality)4>::
                                                      fetch_tile_name(&fetcher->fetcher,0x14);
                                                      if (end != 0x6a) {
switchD_001ab0f6_caseD_6a:
                                                        do_external_slot((fetcher->fetcher).base,
                                                                         0xd4);
                                                        if (end != 0x6b) {
switchD_001ab0f6_caseD_6b:
                                                          SMSSequencer<(TI::TMS::Personality)4>::
                                                          fetch<107>(fetcher);
                                                          if ((end & 0xfffffffeU) != 0x6c) {
switchD_001ab0f6_caseD_6d:
                                                            SMSFetcher<(TI::TMS::Personality)4>::
                                                            fetch_tile_name(&fetcher->fetcher,0x15);
                                                            if (end != 0x6e) {
switchD_001ab0f6_caseD_6e:
                                                              SMSSequencer<(TI::TMS::Personality)4>
                                                              ::fetch<110>(fetcher);
                                                              if (end != 0x6f) {
switchD_001ab0f6_caseD_6f:
                                                                                                                                
                                                  SMSSequencer<(TI::TMS::Personality)4>::fetch<111>
                                                            (fetcher);
                                                  if ((end & 0xfffffffeU) != 0x70) {
switchD_001ab0f6_caseD_71:
                                                    SMSFetcher<(TI::TMS::Personality)4>::
                                                    fetch_tile_name(&fetcher->fetcher,0x16);
                                                    if (end != 0x72) {
switchD_001ab0f6_caseD_72:
                                                      SMSSequencer<(TI::TMS::Personality)4>::
                                                      fetch<114>(fetcher);
                                                      if (end != 0x73) {
switchD_001ab0f6_caseD_73:
                                                        SMSSequencer<(TI::TMS::Personality)4>::
                                                        fetch<115>(fetcher);
                                                        if ((end & 0xfffffffeU) != 0x74) {
switchD_001ab0f6_caseD_75:
                                                          SMSFetcher<(TI::TMS::Personality)4>::
                                                          fetch_tile_name(&fetcher->fetcher,0x17);
                                                          if (end != 0x76) {
switchD_001ab0f6_caseD_76:
                                                            SMSSequencer<(TI::TMS::Personality)4>::
                                                            fetch<118>(fetcher);
                                                            if (end != 0x77) {
switchD_001ab0f6_caseD_77:
                                                              SMSSequencer<(TI::TMS::Personality)4>
                                                              ::fetch<119>(fetcher);
                                                              if ((end & 0xfffffffeU) != 0x78) {
switchD_001ab0f6_caseD_79:
                                                                SMSFetcher<(TI::TMS::Personality)4>
                                                                ::fetch_tile_name(&fetcher->fetcher,
                                                                                  0x18);
                                                                if (end != 0x7a) {
switchD_001ab0f6_caseD_7a:
                                                                  do_external_slot((fetcher->fetcher
                                                                                   ).base,0xf4);
                                                                  if (end != 0x7b) {
switchD_001ab0f6_caseD_7b:
                                                                                                                                        
                                                  SMSSequencer<(TI::TMS::Personality)4>::fetch<123>
                                                            (fetcher);
                                                  if ((end & 0xfffffffeU) != 0x7c) {
switchD_001ab0f6_caseD_7d:
                                                    SMSFetcher<(TI::TMS::Personality)4>::
                                                    fetch_tile_name(&fetcher->fetcher,0x19);
                                                    if (end != 0x7e) {
switchD_001ab0f6_caseD_7e:
                                                      SMSSequencer<(TI::TMS::Personality)4>::
                                                      fetch<126>(fetcher);
                                                      if (end != 0x7f) {
switchD_001ab0f6_caseD_7f:
                                                        SMSSequencer<(TI::TMS::Personality)4>::
                                                        fetch<127>(fetcher);
                                                        if ((end & 0xfffffffeU) != 0x80) {
switchD_001ab0f6_caseD_81:
                                                          SMSFetcher<(TI::TMS::Personality)4>::
                                                          fetch_tile_name(&fetcher->fetcher,0x1a);
                                                          if (end != 0x82) {
switchD_001ab0f6_caseD_82:
                                                            SMSSequencer<(TI::TMS::Personality)4>::
                                                            fetch<130>(fetcher);
                                                            if (end != 0x83) {
switchD_001ab0f6_caseD_83:
                                                              SMSSequencer<(TI::TMS::Personality)4>
                                                              ::fetch<131>(fetcher);
                                                              if ((end & 0xfffffffeU) != 0x84) {
switchD_001ab0f6_caseD_85:
                                                                SMSFetcher<(TI::TMS::Personality)4>
                                                                ::fetch_tile_name(&fetcher->fetcher,
                                                                                  0x1b);
                                                                if (end != 0x86) {
switchD_001ab0f6_caseD_86:
                                                                                                                                    
                                                  SMSSequencer<(TI::TMS::Personality)4>::fetch<134>
                                                            (fetcher);
                                                  if (end != 0x87) {
switchD_001ab0f6_caseD_87:
                                                    SMSSequencer<(TI::TMS::Personality)4>::
                                                    fetch<135>(fetcher);
                                                    if ((end & 0xfffffffeU) != 0x88) {
switchD_001ab0f6_caseD_89:
                                                      SMSFetcher<(TI::TMS::Personality)4>::
                                                      fetch_tile_name(&fetcher->fetcher,0x1c);
                                                      if (end != 0x8a) {
switchD_001ab0f6_caseD_8a:
                                                        do_external_slot((fetcher->fetcher).base,
                                                                         0x114);
                                                        if (end != 0x8b) {
switchD_001ab0f6_caseD_8b:
                                                          SMSSequencer<(TI::TMS::Personality)4>::
                                                          fetch<139>(fetcher);
                                                          if ((end & 0xfffffffeU) != 0x8c) {
switchD_001ab0f6_caseD_8d:
                                                            SMSFetcher<(TI::TMS::Personality)4>::
                                                            fetch_tile_name(&fetcher->fetcher,0x1d);
                                                            if (end != 0x8e) {
switchD_001ab0f6_caseD_8e:
                                                              SMSSequencer<(TI::TMS::Personality)4>
                                                              ::fetch<142>(fetcher);
                                                              if (end != 0x8f) {
switchD_001ab0f6_caseD_8f:
                                                                                                                                
                                                  SMSSequencer<(TI::TMS::Personality)4>::fetch<143>
                                                            (fetcher);
                                                  if ((end & 0xfffffffeU) != 0x90) {
switchD_001ab0f6_caseD_91:
                                                    SMSFetcher<(TI::TMS::Personality)4>::
                                                    fetch_tile_name(&fetcher->fetcher,0x1e);
                                                    if (end != 0x92) {
switchD_001ab0f6_caseD_92:
                                                      SMSSequencer<(TI::TMS::Personality)4>::
                                                      fetch<146>(fetcher);
                                                      if (end != 0x93) {
switchD_001ab0f6_caseD_93:
                                                        SMSSequencer<(TI::TMS::Personality)4>::
                                                        fetch<147>(fetcher);
                                                        if ((end & 0xfffffffeU) != 0x94) {
switchD_001ab0f6_caseD_95:
                                                          SMSFetcher<(TI::TMS::Personality)4>::
                                                          fetch_tile_name(&fetcher->fetcher,0x1f);
                                                          if (end != 0x96) {
switchD_001ab0f6_caseD_96:
                                                            SMSSequencer<(TI::TMS::Personality)4>::
                                                            fetch<150>(fetcher);
                                                            if (end != 0x97) {
switchD_001ab0f6_caseD_97:
                                                              SMSSequencer<(TI::TMS::Personality)4>
                                                              ::fetch<151>(fetcher);
                                                              if ((end & 0xfffffffeU) != 0x98) {
switchD_001ab0f6_caseD_99:
                                                                do_external_slot((fetcher->fetcher).
                                                                                 base,0x132);
                                                                if (end != 0x9a) {
switchD_001ab0f6_caseD_9a:
                                                                  do_external_slot((fetcher->fetcher
                                                                                   ).base,0x134);
                                                                  if (end != 0x9b) {
switchD_001ab0f6_caseD_9b:
                                                                    do_external_slot((fetcher->
                                                                                     fetcher).base,
                                                                                     0x136);
                                                                    if (end != 0x9c) {
switchD_001ab0f6_caseD_9c:
                                                                      do_external_slot((fetcher->
                                                                                       fetcher).base
                                                                                       ,0x138);
                                                                      if (end != 0x9d) {
switchD_001ab0f6_caseD_9d:
                                                                                                                                                
                                                  SMSSequencer<(TI::TMS::Personality)4>::fetch<157>
                                                            (fetcher);
                                                  if (0xb < end - 0x9eU) {
switchD_001ab0f6_caseD_a9:
                                                    do_external_slot((fetcher->fetcher).base,0x152);
                                                    if (end != 0xaa) {
switchD_001ab0f6_caseD_aa:
                                                      do_external_slot((fetcher->fetcher).base,0x154
                                                                      );
                                                      return;
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Base<personality>::dispatch(SequencerT &fetcher, int start, int end) {
#define index(n)						\
	if(use_end && end == n) return;		\
	[[fallthrough]];					\
	case n: fetcher.template fetch<from_internal<personality, Clock::FromStartOfSync>(n)>();

	switch(start) {
		default: assert(false);
		index(0);	index(1);	index(2);	index(3);	index(4);	index(5);	index(6);	index(7);	index(8);	index(9);
		index(10);	index(11);	index(12);	index(13);	index(14);	index(15);	index(16);	index(17);	index(18);	index(19);
		index(20);	index(21);	index(22);	index(23);	index(24);	index(25);	index(26);	index(27);	index(28);	index(29);
		index(30);	index(31);	index(32);	index(33);	index(34);	index(35);	index(36);	index(37);	index(38);	index(39);
		index(40);	index(41);	index(42);	index(43);	index(44);	index(45);	index(46);	index(47);	index(48);	index(49);
		index(50);	index(51);	index(52);	index(53);	index(54);	index(55);	index(56);	index(57);	index(58);	index(59);
		index(60);	index(61);	index(62);	index(63);	index(64);	index(65);	index(66);	index(67);	index(68);	index(69);
		index(70);	index(71);	index(72);	index(73);	index(74);	index(75);	index(76);	index(77);	index(78);	index(79);
		index(80);	index(81);	index(82);	index(83);	index(84);	index(85);	index(86);	index(87);	index(88);	index(89);
		index(90);	index(91);	index(92);	index(93);	index(94);	index(95);	index(96);	index(97);	index(98);	index(99);
		index(100);	index(101);	index(102);	index(103);	index(104);	index(105);	index(106);	index(107);	index(108);	index(109);
		index(110);	index(111);	index(112);	index(113);	index(114);	index(115);	index(116);	index(117);	index(118);	index(119);
		index(120);	index(121);	index(122);	index(123);	index(124);	index(125);	index(126);	index(127);	index(128);	index(129);
		index(130);	index(131);	index(132);	index(133);	index(134);	index(135);	index(136);	index(137);	index(138);	index(139);
		index(140);	index(141);	index(142);	index(143);	index(144);	index(145);	index(146);	index(147);	index(148);	index(149);
		index(150);	index(151);	index(152);	index(153);	index(154);	index(155);	index(156);	index(157);	index(158);	index(159);
		index(160);	index(161);	index(162);	index(163);	index(164);	index(165);	index(166);	index(167);	index(168);	index(169);
		index(170);
	}

#undef index
}